

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_paramtype.cc
# Opt level: O1

Type * __thiscall ParameterizedType::DoClone(ParameterizedType *this)

{
  ExprList *pEVar1;
  int iVar2;
  Type *this_00;
  undefined4 extraout_var;
  int in_ECX;
  void *__child_stack;
  __fn *in_RSI;
  void *in_R8;
  
  this_00 = (Type *)operator_new(0x1a8);
  iVar2 = ID::clone(this->type_id_,in_RSI,__child_stack,in_ECX,in_R8);
  pEVar1 = this->args_;
  Type::Type(this_00,PARAMETERIZED);
  (this_00->super_DataDepElement)._vptr_DataDepElement =
       (_func_int **)&PTR__ParameterizedType_001453e8;
  this_00[1].super_DataDepElement._vptr_DataDepElement = (_func_int **)CONCAT44(extraout_var,iVar2);
  *(ExprList **)&this_00[1].super_DataDepElement.dde_type_ = pEVar1;
  *(undefined1 *)&this_00[1].super_Object.filename._M_dataplus._M_p = 0;
  return this_00;
}

Assistant:

Type* ParameterizedType::DoClone() const
	{
	return new ParameterizedType(type_id_->clone(), args_);
	}